

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O2

void __thiscall
Clasp::ClaspFacade::SolveStrategy::detachAlgo
          (SolveStrategy *this,bool more,int nException,int state)

{
  long *plVar1;
  EventHandler *pEVar2;
  char *unaff_R15;
  undefined1 auVar3 [12];
  StepReady local_38;
  
  if (nException == 1) {
    auVar3 = __cxa_rethrow();
    plVar1 = (long *)__cxa_begin_catch(auVar3._0_8_);
    if (auVar3._8_4_ == 2) {
      (**(code **)(*plVar1 + 0x10))(plVar1);
      std::__cxx11::string::assign(unaff_R15);
      __cxa_end_catch();
    }
    else {
      std::__cxx11::string::assign(unaff_R15);
      __cxa_end_catch();
    }
    __cxa_end_catch();
    return;
  }
  switch(state) {
  case 0:
    if (nException != 0) {
      SolveAlgorithm::stop(this->algo_);
LAB_0011747e:
      stopStep(this->facade_,(this->signal_).super___atomic_base<unsigned_int>._M_i,!more);
      goto switchD_00117463_caseD_2;
    }
    SolveAlgorithm::stop(this->algo_);
    break;
  case 1:
    if (nException != 0) goto LAB_0011747e;
    break;
  case 2:
switchD_00117463_caseD_2:
    pEVar2 = this->handler_;
    if (pEVar2 == (EventHandler *)0x0) goto switchD_00117463_caseD_3;
    if (nException != 0) {
      StepReady::StepReady(&local_38,&this->facade_->step_);
      (*(pEVar2->super_ModelHandler)._vptr_ModelHandler[4])(pEVar2,&local_38);
      goto switchD_00117463_caseD_3;
    }
    goto LAB_001174e2;
  case 3:
    goto switchD_00117463_caseD_3;
  default:
    goto switchD_00117463_default;
  }
  stopStep(this->facade_,(this->signal_).super___atomic_base<unsigned_int>._M_i,!more);
  pEVar2 = this->handler_;
  if (pEVar2 != (EventHandler *)0x0) {
LAB_001174e2:
    StepReady::StepReady(&local_38,&this->facade_->step_);
    (*(pEVar2->super_ModelHandler)._vptr_ModelHandler[4])(pEVar2,&local_38);
  }
switchD_00117463_caseD_3:
  this->result_ = (this->facade_->step_).result;
  local_38.super_Event_t<Clasp::ClaspFacade::StepReady>.super_Event = (Event)0x0;
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::resize
            (&this->facade_->assume_,this->aTop_,(Literal *)&local_38);
  (*this->_vptr_SolveStrategy[4])(this,3);
switchD_00117463_default:
  return;
}

Assistant:

void ClaspFacade::SolveStrategy::detachAlgo(bool more, int nException, int state) {
#define PROTECT(ec, X) if ((ec)) try { X; } catch (...) {} else X
	try {
		if (nException == 1) { throw; }
		switch (state) {
			case 0: ++state; PROTECT(nException, algo_->stop());  // FALLTHROUGH
			case 1: ++state; PROTECT(nException, facade_->stopStep(signal_, !more));  // FALLTHROUGH
			case 2: ++state; if (handler_) { PROTECT(nException, handler_->onEvent(StepReady(facade_->summary()))); }   // FALLTHROUGH
			case 3: state = -1;
				result_ = facade_->result();
				facade_->assume_.resize(aTop_);
				doNotify(event_detach);
			default:	break;
		}
	}
	catch (...) {
		error_ = "Operation failed: ";
		if (!signal_)    { signal_ = SIGERROR; }
		if (state != -1) { detachAlgo(more, 2, state); }
		if ((mode_ & SolveMode_t::Async) == 0) {
			error_ += "exception thrown";
			throw;
		}
		try { throw; }
		catch (const std::exception& e) { error_ = e.what(); }
		catch (...)                     { error_ = "unknown error"; }
	}
}